

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void kj::ctor<kj::_::ImmediatePromiseNode<kj::AuthenticatedStream>,kj::AuthenticatedStream>
               (ImmediatePromiseNode<kj::AuthenticatedStream> *location,AuthenticatedStream *params)

{
  ImmediatePromiseNode<kj::AuthenticatedStream> *this;
  AuthenticatedStream *value;
  ExceptionOr<kj::AuthenticatedStream> local_1e0;
  undefined1 local_1a;
  NoInfer<kj::AuthenticatedStream> *local_18;
  AuthenticatedStream *params_local;
  ImmediatePromiseNode<kj::AuthenticatedStream> *location_local;
  
  local_18 = params;
  params_local = (AuthenticatedStream *)location;
  this = (ImmediatePromiseNode<kj::AuthenticatedStream> *)operator_new(0x1d0);
  if (this != (ImmediatePromiseNode<kj::AuthenticatedStream> *)0x0) {
    local_1a = 1;
    value = fwd<kj::AuthenticatedStream>(local_18);
    _::ExceptionOr<kj::AuthenticatedStream>::ExceptionOr(&local_1e0,value);
    _::ImmediatePromiseNode<kj::AuthenticatedStream>::ImmediatePromiseNode(this,&local_1e0);
  }
  local_1a = 0;
  if (this != (ImmediatePromiseNode<kj::AuthenticatedStream> *)0x0) {
    _::ExceptionOr<kj::AuthenticatedStream>::~ExceptionOr(&local_1e0);
  }
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}